

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

char * __thiscall QTreeModel::index(QTreeModel *this,char *__s,int __c)

{
  bool bVar1;
  int iVar2;
  QTreeWidgetItem *adata;
  QTreeWidgetItem *pQVar3;
  int in_ECX;
  undefined8 in_R8;
  QTreeWidgetItem *itm;
  QTreeWidgetItem *parentItem;
  int c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QModelIndex *in_stack_ffffffffffffffb0;
  QTreeModel *this_00;
  
  this_00 = this;
  executePendingSort(this);
  iVar2 = (**(code **)(*(long *)__s + 0x80))(__s,in_R8);
  if (((__c < 0) || (in_ECX < 0)) || (iVar2 <= in_ECX)) {
    QModelIndex::QModelIndex((QModelIndex *)0x90eb2c);
  }
  else {
    bVar1 = QModelIndex::isValid(in_stack_ffffffffffffffb0);
    if (bVar1) {
      adata = item((QTreeModel *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   (QModelIndex *)0x90eb50);
    }
    else {
      adata = *(QTreeWidgetItem **)(__s + 0x10);
    }
    if ((adata != (QTreeWidgetItem *)0x0) &&
       (iVar2 = QTreeWidgetItem::childCount((QTreeWidgetItem *)0x90eb89), __c < iVar2)) {
      pQVar3 = QTreeWidgetItem::child((QTreeWidgetItem *)this,(int)((ulong)adata >> 0x20));
      if (pQVar3 != (QTreeWidgetItem *)0x0) {
        QAbstractItemModel::createIndex
                  (&this_00->super_QAbstractItemModel,(int)((ulong)this >> 0x20),(int)this,adata);
        return (char *)this_00;
      }
      QModelIndex::QModelIndex((QModelIndex *)0x90ebd6);
      return (char *)this_00;
    }
    QModelIndex::QModelIndex((QModelIndex *)0x90ebe2);
  }
  return (char *)this_00;
}

Assistant:

QModelIndex QTreeModel::index(int row, int column, const QModelIndex &parent) const
{
    executePendingSort();

    int c = columnCount(parent);
    if (row < 0 || column < 0 || column >= c)
        return QModelIndex();

    QTreeWidgetItem *parentItem = parent.isValid() ? item(parent) : rootItem;
    if (parentItem && row < parentItem->childCount()) {
        QTreeWidgetItem *itm = parentItem->child(row);
        if (itm)
            return createIndex(row, column, itm);
        return QModelIndex();
    }

    return QModelIndex();
}